

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O2

void __thiscall t_js_generator::generate_service(t_js_generator *this,t_service *tservice)

{
  int *piVar1;
  string *psVar2;
  t_program *ptVar3;
  int iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  int __oflag;
  int __oflag_00;
  pointer pptVar6;
  t_service *ptVar7;
  pointer pptVar8;
  pointer pptVar9;
  string f_service_ts_name;
  string f_service_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  ofstream_with_content_based_conditional_update *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  ofstream_with_content_based_conditional_update *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_98,this);
  psVar2 = &(this->super_t_oop_generator).super_t_generator.service_name_;
  std::operator+(&local_c0,&local_98,psVar2);
  std::operator+(&local_50,&local_c0,".js");
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_c0,local_50._M_dataplus._M_p,(allocator *)&local_98)
  ;
  local_78 = &this->f_service_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (local_78,(char *)&local_c0,__oflag);
  std::__cxx11::string::~string((string *)&local_c0);
  if (this->gen_episode_file_ == true) {
    poVar5 = std::operator<<((ostream *)&this->f_episode_,(string *)psVar2);
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = std::operator<<(poVar5,(string *)&this->thrift_package_output_directory_);
    poVar5 = std::operator<<(poVar5,"/");
    poVar5 = std::operator<<(poVar5,(string *)psVar2);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  if (this->gen_ts_ == true) {
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_70);
    std::operator+(&local_98,&local_70,psVar2);
    std::operator+(&local_c0,&local_98,".d.ts");
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string
              ((string *)&local_98,local_c0._M_dataplus._M_p,(allocator *)&local_70);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
              (&this->f_service_ts_,(char *)&local_98,__oflag_00);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_c0);
  std::operator<<((ostream *)local_78,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  if (((this->gen_node_ != false) || (this->gen_es6_ == true)) && (this->no_ns_ == true)) {
    poVar5 = std::operator<<((ostream *)local_78,"\"use strict\";");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  js_includes_abi_cxx11_(&local_c0,this);
  poVar5 = std::operator<<((ostream *)local_78,(string *)&local_c0);
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  render_includes_abi_cxx11_(&local_98,this);
  poVar5 = std::operator<<(poVar5,(string *)&local_98);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_c0);
  if (this->gen_ts_ == true) {
    if (tservice->extends_ != (t_service *)0x0) {
      poVar5 = std::operator<<((ostream *)&this->f_service_ts_,"/// <reference path=\"");
      iVar4 = (*(tservice->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var,iVar4));
      poVar5 = std::operator<<(poVar5,".d.ts\" />");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    }
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_c0,this);
    local_a0 = &this->f_service_ts_;
    poVar5 = std::operator<<((ostream *)local_a0,(string *)&local_c0);
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    ts_includes_abi_cxx11_(&local_98,this);
    poVar5 = std::operator<<(poVar5,(string *)&local_98);
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    render_ts_includes_abi_cxx11_(&local_70,this);
    poVar5 = std::operator<<(poVar5,(string *)&local_70);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_c0);
    if (this->gen_node_ == true) {
      std::operator+(&local_98,"import ttypes = require(\'./",
                     &((this->super_t_oop_generator).super_t_generator.program_)->name_);
      std::operator+(&local_c0,&local_98,"_types\');");
      poVar5 = std::operator<<((ostream *)local_a0,(string *)&local_c0);
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_98);
      ptVar3 = (this->super_t_oop_generator).super_t_generator.program_;
      for (pptVar8 = (ptVar3->enums_).super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pptVar8 !=
          (ptVar3->enums_).super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar8 = pptVar8 + 1) {
        poVar5 = std::operator<<((ostream *)local_a0,"import ");
        iVar4 = (*((*pptVar8)->super_t_type).super_t_doc._vptr_t_doc[3])();
        poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_00,iVar4));
        poVar5 = std::operator<<(poVar5," = ttypes.");
        js_namespace_abi_cxx11_
                  (&local_c0,this,(this->super_t_oop_generator).super_t_generator.program_);
        poVar5 = std::operator<<(poVar5,(string *)&local_c0);
        iVar4 = (*((*pptVar8)->super_t_type).super_t_doc._vptr_t_doc[3])();
        poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_01,iVar4));
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_c0);
      }
      ptVar3 = (this->super_t_oop_generator).super_t_generator.program_;
      for (pptVar6 = (ptVar3->consts_).super__Vector_base<t_const_*,_std::allocator<t_const_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pptVar6 !=
          (ptVar3->consts_).super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
        poVar5 = std::operator<<((ostream *)local_a0,"import ");
        std::__cxx11::string::string((string *)&local_c0,(string *)&(*pptVar6)->name_);
        poVar5 = std::operator<<(poVar5,(string *)&local_c0);
        poVar5 = std::operator<<(poVar5," = ttypes.");
        js_namespace_abi_cxx11_
                  (&local_98,this,(this->super_t_oop_generator).super_t_generator.program_);
        poVar5 = std::operator<<(poVar5,(string *)&local_98);
        std::__cxx11::string::string((string *)&local_70,(string *)&(*pptVar6)->name_);
        poVar5 = std::operator<<(poVar5,(string *)&local_70);
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_c0);
      }
      ptVar3 = (this->super_t_oop_generator).super_t_generator.program_;
      for (pptVar9 = (ptVar3->xceptions_).
                     super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pptVar9 !=
          (ptVar3->xceptions_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar9 = pptVar9 + 1) {
        poVar5 = std::operator<<((ostream *)local_a0,"import ");
        iVar4 = (*((*pptVar9)->super_t_type).super_t_doc._vptr_t_doc[3])();
        poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_02,iVar4));
        poVar5 = std::operator<<(poVar5," = ttypes.");
        js_namespace_abi_cxx11_
                  (&local_c0,this,(this->super_t_oop_generator).super_t_generator.program_);
        poVar5 = std::operator<<(poVar5,(string *)&local_c0);
        iVar4 = (*((*pptVar9)->super_t_type).super_t_doc._vptr_t_doc[3])();
        poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_03,iVar4));
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_c0);
      }
      ptVar3 = (this->super_t_oop_generator).super_t_generator.program_;
      for (pptVar9 = (ptVar3->structs_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pptVar9 !=
          (ptVar3->structs_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar9 = pptVar9 + 1) {
        poVar5 = std::operator<<((ostream *)local_a0,"import ");
        iVar4 = (*((*pptVar9)->super_t_type).super_t_doc._vptr_t_doc[3])();
        poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_04,iVar4));
        poVar5 = std::operator<<(poVar5," = ttypes.");
        js_namespace_abi_cxx11_
                  (&local_c0,this,(this->super_t_oop_generator).super_t_generator.program_);
        poVar5 = std::operator<<(poVar5,(string *)&local_c0);
        iVar4 = (*((*pptVar9)->super_t_type).super_t_doc._vptr_t_doc[3])();
        poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_05,iVar4));
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_c0);
      }
    }
    else {
      poVar5 = std::operator<<((ostream *)local_a0,"import { ");
      poVar5 = std::operator<<(poVar5,(string *)
                                      &((this->super_t_oop_generator).super_t_generator.program_)->
                                       name_);
      poVar5 = std::operator<<(poVar5," } from \"./");
      poVar5 = std::operator<<(poVar5,(string *)
                                      &((this->super_t_oop_generator).super_t_generator.program_)->
                                       name_);
      poVar5 = std::operator<<(poVar5,"_types\";");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    }
    if ((this->ts_module_)._M_string_length != 0) {
      if (this->gen_node_ == true) {
        poVar5 = std::operator<<((ostream *)local_a0,"declare module ");
        poVar5 = std::operator<<(poVar5,(string *)&this->ts_module_);
        std::operator<<(poVar5," {");
      }
      else {
        poVar5 = std::operator<<((ostream *)local_a0,"declare module \"./");
        poVar5 = std::operator<<(poVar5,(string *)
                                        &((this->super_t_oop_generator).super_t_generator.program_)
                                         ->name_);
        poVar5 = std::operator<<(poVar5,"_types\" {");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        ts_indent_abi_cxx11_(&local_c0,this);
        poVar5 = std::operator<<((ostream *)local_a0,(string *)&local_c0);
        poVar5 = std::operator<<(poVar5,"module ");
        poVar5 = std::operator<<(poVar5,(string *)
                                        &((this->super_t_oop_generator).super_t_generator.program_)
                                         ->name_);
        poVar5 = std::operator<<(poVar5," {");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_c0);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
      }
    }
  }
  if (this->gen_node_ == true) {
    if (tservice->extends_ != (t_service *)0x0) {
      psVar2 = &this->js_const_type_;
      poVar5 = std::operator<<((ostream *)local_78,(string *)psVar2);
      iVar4 = (*(tservice->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_06,iVar4));
      poVar5 = std::operator<<(poVar5," = require(\'./");
      iVar4 = (*(tservice->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_07,iVar4));
      poVar5 = std::operator<<(poVar5,"\');");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,(string *)psVar2);
      iVar4 = (*(tservice->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_08,iVar4));
      poVar5 = std::operator<<(poVar5,"Client = ");
      iVar4 = (*(tservice->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_09,iVar4));
      poVar5 = std::operator<<(poVar5,".Client;");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,(string *)psVar2);
      iVar4 = (*(tservice->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_10,iVar4));
      poVar5 = std::operator<<(poVar5,"Processor = ");
      iVar4 = (*(tservice->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_11,iVar4));
      poVar5 = std::operator<<(poVar5,".Processor;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = std::operator<<((ostream *)&this->f_service_ts_,"import ");
      iVar4 = (*(tservice->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_12,iVar4));
      poVar5 = std::operator<<(poVar5," = require(\'./");
      iVar4 = (*(tservice->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_13,iVar4));
      poVar5 = std::operator<<(poVar5,"\');");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    }
    poVar5 = std::operator<<((ostream *)local_78,(string *)&this->js_const_type_);
    std::operator+(&local_98,"ttypes = require(\'./",
                   &((this->super_t_oop_generator).super_t_generator.program_)->name_);
    std::operator+(&local_c0,&local_98,"_types\');");
    poVar5 = std::operator<<(poVar5,(string *)&local_c0);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_98);
  }
  generate_service_helpers(this,tservice);
  ptVar7 = tservice;
  generate_service_client(this,tservice);
  iVar4 = (int)ptVar7;
  if (this->gen_node_ == true) {
    generate_service_processor(this,tservice);
    iVar4 = (int)tservice;
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (local_78,iVar4);
  if (this->gen_ts_ == true) {
    if ((this->ts_module_)._M_string_length != 0) {
      if (this->gen_node_ != true) {
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        ts_indent_abi_cxx11_(&local_c0,this);
        poVar5 = std::operator<<((ostream *)&this->f_service_ts_,(string *)&local_c0);
        poVar5 = std::operator<<(poVar5,"}");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_c0);
      }
      poVar5 = std::operator<<((ostream *)&this->f_service_ts_,"}");
      iVar4 = 0x36c2d8;
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    }
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
              (&this->f_service_ts_,iVar4);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void t_js_generator::generate_service(t_service* tservice) {
  string f_service_name = get_out_dir() + service_name_ + ".js";
  f_service_.open(f_service_name.c_str());
  if (gen_episode_file_) {
    f_episode_ << service_name_ << ":" << thrift_package_output_directory_ << "/" << service_name_ << endl;
  }

  if (gen_ts_) {
    string f_service_ts_name = get_out_dir() + service_name_ + ".d.ts";
    f_service_ts_.open(f_service_ts_name.c_str());
  }

  f_service_ << autogen_comment();

  if ((gen_node_ || gen_es6_) && no_ns_) {
    f_service_ << "\"use strict\";" << endl << endl;
  }

  f_service_ << js_includes() << endl << render_includes() << endl;

  if (gen_ts_) {
    if (tservice->get_extends() != nullptr) {
      f_service_ts_ << "/// <reference path=\"" << tservice->get_extends()->get_name()
                    << ".d.ts\" />" << endl;
    }
    f_service_ts_ << autogen_comment() << endl << ts_includes() << endl << render_ts_includes() << endl;
    if (gen_node_) {
      f_service_ts_ << "import ttypes = require('./" + program_->get_name() + "_types');" << endl;
      // Generate type aliases
      // enum
      vector<t_enum*> const& enums = program_->get_enums();
      vector<t_enum*>::const_iterator e_iter;
      for (e_iter = enums.begin(); e_iter != enums.end(); ++e_iter) {
        f_service_ts_ << "import " << (*e_iter)->get_name() << " = ttypes."
                  << js_namespace(program_) << (*e_iter)->get_name() << endl;
      }
      // const
      vector<t_const*> const& consts = program_->get_consts();
      vector<t_const*>::const_iterator c_iter;
      for (c_iter = consts.begin(); c_iter != consts.end(); ++c_iter) {
        f_service_ts_ << "import " << (*c_iter)->get_name() << " = ttypes."
                  << js_namespace(program_) << (*c_iter)->get_name() << endl;
      }
      // exception
      vector<t_struct*> const& exceptions = program_->get_xceptions();
      vector<t_struct*>::const_iterator x_iter;
      for (x_iter = exceptions.begin(); x_iter != exceptions.end(); ++x_iter) {
        f_service_ts_ << "import " << (*x_iter)->get_name() << " = ttypes."
                  << js_namespace(program_) << (*x_iter)->get_name() << endl;
      }
      // structs
      vector<t_struct*> const& structs = program_->get_structs();
      vector<t_struct*>::const_iterator s_iter;
      for (s_iter = structs.begin(); s_iter != structs.end(); ++s_iter) {
        f_service_ts_ << "import " << (*s_iter)->get_name() << " = ttypes."
                  << js_namespace(program_) << (*s_iter)->get_name() << endl;
      }
    } else {
      f_service_ts_ << "import { " << program_->get_name() << " } from \"./" << program_->get_name() << "_types\";" << endl << endl;
    }
    if (!ts_module_.empty()) {
      if (gen_node_) {
        f_service_ts_ << "declare module " << ts_module_ << " {";
      } else {
        f_service_ts_ << "declare module \"./" << program_->get_name() << "_types\" {" << endl;
        indent_up();
        f_service_ts_ << ts_indent() << "module " << program_->get_name() << " {" << endl;
        indent_up();
      }
    }
  }

  if (gen_node_) {
    if (tservice->get_extends() != nullptr) {
      f_service_ << js_const_type_ <<  tservice->get_extends()->get_name() << " = require('./"
                 << tservice->get_extends()->get_name() << "');" << endl << js_const_type_
                 << tservice->get_extends()->get_name()
                 << "Client = " << tservice->get_extends()->get_name() << ".Client;" << endl
                 << js_const_type_ << tservice->get_extends()->get_name()
                 << "Processor = " << tservice->get_extends()->get_name() << ".Processor;" << endl;

      f_service_ts_ << "import " << tservice->get_extends()->get_name() << " = require('./"
                    << tservice->get_extends()->get_name() << "');" << endl;
    }

    f_service_ << js_const_type_ << "ttypes = require('./" + program_->get_name() + "_types');" << endl;
  }

  generate_service_helpers(tservice);
  generate_service_interface(tservice);
  generate_service_client(tservice);

  if (gen_node_) {
    generate_service_processor(tservice);
  }

  f_service_.close();
  if (gen_ts_) {
    if (!ts_module_.empty()) {
      if (gen_node_) {
        f_service_ts_ << "}" << endl;
      } else {
        indent_down();
        f_service_ts_ << ts_indent() << "}" << endl;
        f_service_ts_ << "}" << endl;
      }
    }
    f_service_ts_.close();
  }
}